

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manual-optimizer.cpp
# Opt level: O0

void __thiscall
manual_course::manual_course
          (manual_course *this,double theta_,double delta_,double kappa_min_,double kappa_step_,
          double init_policy_random_,int length_)

{
  double dVar1;
  int iVar2;
  type pdVar3;
  int local_60;
  int local_5c;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int length__local;
  double init_policy_random__local;
  double kappa_step__local;
  double kappa_min__local;
  double delta__local;
  double theta__local;
  manual_course *this_local;
  
  std::make_unique<double[]>((size_t)this);
  std::make_unique<double[]>((size_t)&this->delta);
  std::make_unique<double[]>((size_t)&this->kappa_min);
  std::make_unique<double[]>((size_t)&this->kappa_step);
  std::make_unique<double[]>((size_t)&this->init_policy_random);
  std::make_unique<int[]>((size_t)&this->iterators);
  this->length = length_;
  if (this->length < 3) {
    baryonyx::details::fail_fast
              ("Postcondition","length > 2",
               "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/manual-optimizer.cpp"
               ,"56");
  }
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->theta,0);
  *pdVar3 = theta_;
  iVar2 = this->length;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->theta,1);
  *pdVar3 = 1.0 / (double)iVar2;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->delta,0);
  *pdVar3 = delta_;
  iVar2 = this->length;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->delta,1);
  *pdVar3 = 0.1 / (double)iVar2;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->kappa_min,0)
  ;
  *pdVar3 = kappa_min_;
  iVar2 = this->length;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[](&this->kappa_min,1)
  ;
  *pdVar3 = 0.01 / (double)iVar2;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (&this->kappa_step,0);
  *pdVar3 = kappa_step_;
  iVar2 = this->length;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (&this->kappa_step,1);
  *pdVar3 = 1e-07 / (double)iVar2;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (&this->init_policy_random,0);
  *pdVar3 = init_policy_random_;
  iVar2 = this->length;
  pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                     (&this->init_policy_random,1);
  *pdVar3 = 0.9 / (double)iVar2;
  for (i_2 = 2; i_2 != this->length; i_2 = i_2 + 1) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->theta,(long)(i_2 + -1));
    dVar1 = *pdVar3;
    iVar2 = this->length;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->theta,(long)i_2);
    *pdVar3 = dVar1 + 1.0 / (double)iVar2;
  }
  for (i_3 = 2; i_3 != this->length; i_3 = i_3 + 1) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->theta,(long)(i_3 + -1));
    dVar1 = *pdVar3;
    iVar2 = this->length;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->delta,(long)i_3);
    *pdVar3 = dVar1 + 0.1 / ((double)iVar2 * 5.0);
  }
  for (i_4 = 2; i_4 != this->length; i_4 = i_4 + 1) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->theta,(long)(i_4 + -1));
    dVar1 = *pdVar3;
    iVar2 = this->length;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->kappa_min,(long)i_4);
    *pdVar3 = dVar1 + 0.01 / (double)iVar2;
  }
  for (local_5c = 2; local_5c != this->length; local_5c = local_5c + 1) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->theta,(long)(local_5c + -1));
    dVar1 = *pdVar3;
    iVar2 = this->length;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->kappa_step,(long)local_5c);
    *pdVar3 = dVar1 + 1e-07 / ((double)iVar2 * 5.0);
  }
  for (local_60 = 2; local_60 != this->length; local_60 = local_60 + 1) {
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->theta,(long)(local_60 + -1));
    dVar1 = *pdVar3;
    iVar2 = this->length;
    pdVar3 = std::unique_ptr<double[],_std::default_delete<double[]>_>::operator[]
                       (&this->init_policy_random,(long)local_60);
    *pdVar3 = dVar1 + 0.9 / (double)iVar2;
  }
  reset(this);
  return;
}

Assistant:

manual_course(double theta_,
                  double delta_,
                  double kappa_min_,
                  double kappa_step_,
                  double init_policy_random_,
                  int length_)
      : theta(std::make_unique<double[]>(length_))
      , delta(std::make_unique<double[]>(length_))
      , kappa_min(std::make_unique<double[]>(length_))
      , kappa_step(std::make_unique<double[]>(length_))
      , init_policy_random(std::make_unique<double[]>(length_))
      , iterators(std::make_unique<int[]>(length_))
      , length(length_)
    {
        bx_ensures(length > 2);

        theta[0] = theta_;
        theta[1] = 1.0 / static_cast<double>(length);

        delta[0] = delta_;
        delta[1] = 0.1 / static_cast<double>(length);

        kappa_min[0] = kappa_min_;
        kappa_min[1] = 1e-2 / static_cast<double>(length);

        kappa_step[0] = kappa_step_;
        kappa_step[1] = 1e-7 / static_cast<double>(length);

        init_policy_random[0] = init_policy_random_;
        init_policy_random[1] = 0.9 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            theta[i] = theta[i - 1] + 1.0 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            delta[i] =
              theta[i - 1] + 0.1 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            kappa_min[i] = theta[i - 1] + 1e-2 / static_cast<double>(length);

        for (int i = 2; i != length; ++i)
            kappa_step[i] =
              theta[i - 1] + 1e-7 / (5.0 * static_cast<double>(length));

        for (int i = 2; i != length; ++i)
            init_policy_random[i] =
              theta[i - 1] + 0.9 / static_cast<double>(length);

        reset();
    }